

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::generateBoard(Board *this)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  value_type *__val;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  ulong uVar5;
  ulong srcRow;
  size_t sVar6;
  int i;
  int iVar7;
  size_t srcCol;
  __normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_> local_60;
  __normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_> local_58;
  Move *local_50;
  Move local_48 [4];
  undefined1 local_38 [8];
  
  puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    (puVar1,(this->values).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&this->nullValue);
  uVar5 = (ulong)((long)_Var4._M_current - (long)puVar1) >> 3 & 0xffffffff;
  iVar7 = 0;
  uVar5 = uVar5 % this->sizeInt + (uVar5 / this->sizeInt) * 10;
  local_60._M_current = (Move *)operator_new(0x10);
  local_58._M_current = local_60._M_current + 4;
  local_60._M_current[0] = UP;
  local_60._M_current[1] = UP;
  local_60._M_current[2] = UP;
  local_60._M_current[3] = UP;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  srcRow = SUB168(auVar2 * ZEXT816(0x199999999999999a),8);
  srcCol = uVar5 + srcRow * -10;
  local_50 = local_58._M_current;
LAB_00113964:
  if (local_58._M_current != local_60._M_current) {
    local_58._M_current = local_60._M_current;
  }
  local_48[0] = UP;
  local_48[1] = 1;
  local_48[2] = 2;
  local_48[3] = 3;
  std::vector<Move,std::allocator<Move>>::_M_range_insert<Move_const*>
            ((vector<Move,std::allocator<Move>> *)&local_60,local_60._M_current,local_48,local_38);
  do {
    iVar3 = rand();
    local_48[0] = local_60._M_current
                  [(ulong)(long)iVar3 %
                   (ulong)((long)local_58._M_current - (long)local_60._M_current >> 2)];
    if ((local_48[0] == UP) && (srcRow != 0)) {
      sVar6 = srcRow - 1;
      makeMove(this,srcRow,srcCol,sVar6,srcCol);
      goto LAB_00113a1c;
    }
    if (local_48[0] == DOWN) {
      if (srcRow < this->sizeInt - 1) {
        sVar6 = srcRow + 1;
        makeMove(this,srcRow,srcCol,sVar6,srcCol);
        goto LAB_00113a1c;
      }
    }
    else {
      sVar6 = srcRow;
      if (local_48[0] == RIGHT) {
        if (srcCol < this->sizeInt - 1) break;
      }
      else if ((local_48[0] == LEFT) && (srcCol != 0)) {
        makeMove(this,srcRow,srcCol,srcRow,srcCol - 1);
        srcCol = srcCol - 1;
        goto LAB_00113a1c;
      }
    }
    std::
    __remove_if<__gnu_cxx::__normal_iterator<Move*,std::vector<Move,std::allocator<Move>>>,__gnu_cxx::__ops::_Iter_equals_val<Move_const>>
              (local_60,local_58,(_Iter_equals_val<const_Move>)local_48);
  } while( true );
  makeMove(this,srcRow,srcCol,srcRow,srcCol + 1);
  srcCol = srcCol + 1;
LAB_00113a1c:
  iVar7 = iVar7 + 1;
  srcRow = sVar6;
  if (iVar7 == 4000) {
    if (local_60._M_current != (Move *)0x0) {
      operator_delete(local_60._M_current,(long)local_50 - (long)local_60._M_current);
    }
    return;
  }
  goto LAB_00113964;
}

Assistant:

void Board::generateBoard()
{
    size_t emptyTile = findEmptyTilePosition();
    size_t emptyRow = emptyTile / 10;
    size_t emptyCol = emptyTile % 10;

    std::vector<Move> moves( 4 );
    using enum Move;

    for ( int i = 0; i < 4000; i++ )
    {
        moves.clear();
        moves.insert( moves.begin(), { UP, RIGHT, DOWN, LEFT });
        Move move = moves.at( rand() % moves.size() );

        while( true )
        {
            if (( move == UP ) && ( emptyRow > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow - 1, emptyCol );
                emptyRow--;
                break;
            }
            if (( move == RIGHT ) && ( emptyCol < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol + 1 );
                emptyCol++;
                break;
            }
            if (( move == DOWN ) && ( emptyRow < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow + 1, emptyCol );
                emptyRow++;
                break;
            }
            if (( move == LEFT ) && ( emptyCol > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol - 1 );
                emptyCol--;
                break;
            }

            std::remove( moves.begin(), moves.end(), move );
            move = moves[ rand() % moves.size() ];
        }
    }
}